

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O3

exr_result_t
exr_write_scanline_chunk_info(exr_context_t ctxt,int part_index,int y,exr_chunk_info_t *cinfo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  _internal_exr_part *part;
  exr_result_t eVar6;
  int iVar7;
  code *UNRECOVERED_JUMPTABLE_00;
  uint64_t uVar8;
  int lpc;
  int iVar9;
  char *pcVar10;
  undefined8 uVar11;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar6 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar6;
  }
  if (cinfo == (exr_chunk_info_t *)0x0) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uVar11 = 3;
LAB_00121c57:
    eVar6 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,uVar11);
    return eVar6;
  }
  part = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
  if ((part->storage_mode | EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_DEEP_TILED) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uVar11 = 0x12;
    goto LAB_00121c57;
  }
  if (*ctxt != (_priv_exr_context_t)0x3) {
    if (*ctxt == (_priv_exr_context_t)0x1) {
      UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
      uVar11 = 9;
    }
    else {
      UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
      uVar11 = 8;
    }
    goto LAB_00121c57;
  }
  iVar1 = (part->data_window).min.field_0.field_0.y;
  iVar2 = (part->data_window).max.field_0.field_0.y;
  iVar7 = y - iVar1;
  if (iVar2 < y || y < iVar1) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x48);
    pcVar10 = "Invalid request for scanline %d outside range of data window (%d - %d)";
    iVar7 = iVar1;
    iVar5 = iVar2;
LAB_00121d67:
    eVar6 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,3,pcVar10,y,iVar7,iVar5);
    return eVar6;
  }
  iVar3 = (part->data_window).min.field_0.field_0.x;
  iVar4 = (part->data_window).max.field_0.field_0.x;
  lpc = (int)part->lines_per_chunk;
  if (1 < lpc) {
    iVar7 = iVar7 / lpc;
  }
  iVar5 = part->chunk_count;
  if ((iVar7 < 0) || (iVar5 <= iVar7)) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x48);
    pcVar10 = "Invalid request for scanline %d in chunk %d outside chunk count %d";
    goto LAB_00121d67;
  }
  iVar9 = iVar7 * lpc;
  iVar5 = iVar9 + iVar1;
  cinfo->idx = 0;
  cinfo->start_x = 0;
  cinfo->start_y = 0;
  cinfo->height = 0;
  cinfo->sample_count_data_offset = 0;
  cinfo->sample_count_table_size = 0;
  cinfo->packed_size = 0;
  cinfo->unpacked_size = 0;
  cinfo->width = 0;
  cinfo->level_x = '\0';
  cinfo->level_y = '\0';
  cinfo->type = '\0';
  cinfo->compression = '\0';
  cinfo->data_offset = 0;
  cinfo->idx = iVar7;
  cinfo->type = (char)part->storage_mode;
  cinfo->compression = (char)part->comp_type;
  cinfo->start_x = iVar3;
  cinfo->start_y = iVar5;
  iVar7 = (iVar4 - iVar3) + 1;
  cinfo->width = iVar7;
  cinfo->height = lpc;
  if (iVar9 < 0) {
    cinfo->start_y = iVar1;
    iVar9 = iVar9 + lpc;
  }
  else {
    iVar9 = lpc;
    if (iVar5 + lpc <= iVar2) goto LAB_00121d77;
    iVar9 = (iVar2 - iVar5) + 1;
  }
  cinfo->height = iVar9;
LAB_00121d77:
  cinfo->level_x = '\0';
  cinfo->level_y = '\0';
  cinfo->data_offset = 0;
  cinfo->packed_size = 0;
  cinfo->sample_count_data_offset = 0;
  cinfo->sample_count_table_size = 0;
  uVar8 = compute_chunk_unpack_size(y,iVar7,iVar9,lpc,part);
  cinfo->unpacked_size = uVar8;
  return 0;
}

Assistant:

exr_result_t
exr_write_scanline_chunk_info (
    exr_context_t ctxt, int part_index, int y, exr_chunk_info_t* cinfo)
{
    exr_attr_box2i_t dw;
    int              lpc, miny, cidx;
    exr_chunk_info_t nil = {0};

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!cinfo)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_SCAN_TILE_MIXEDAPI));
    }

    if (pctxt->mode != EXR_CONTEXT_WRITING_DATA)
    {
        if (pctxt->mode == EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (
                pctxt->standard_error (pctxt, EXR_ERR_HEADER_NOT_WRITTEN));
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    }

    dw = part->data_window;
    if (y < dw.min.y || y > dw.max.y)
    {
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d outside range of data window (%d - %d)",
            y,
            dw.min.y,
            dw.max.y));
    }

    lpc  = part->lines_per_chunk;
    cidx = (y - dw.min.y);
    if (lpc > 1) cidx /= lpc;

    //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
    //    cidx = part->chunk_count - (cidx + 1);
    miny = cidx * lpc + dw.min.y;

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d in chunk %d outside chunk count %d",
            y,
            cidx,
            part->chunk_count));
    }

    *cinfo             = nil;
    cinfo->idx         = cidx;
    cinfo->type        = (uint8_t) part->storage_mode;
    cinfo->compression = (uint8_t) part->comp_type;
    cinfo->start_x     = dw.min.x;
    cinfo->start_y     = miny;
    cinfo->width       = dw.max.x - dw.min.x + 1;
    cinfo->height      = lpc;
    if (miny < dw.min.y)
    {
        cinfo->start_y = dw.min.y;
        cinfo->height -= (dw.min.y - miny);
    }
    else if ((miny + lpc) > dw.max.y) { cinfo->height = (dw.max.y - miny + 1); }
    cinfo->level_x = 0;
    cinfo->level_y = 0;

    cinfo->sample_count_data_offset = 0;
    cinfo->sample_count_table_size  = 0;
    cinfo->data_offset              = 0;
    cinfo->packed_size              = 0;
    cinfo->unpacked_size =
        compute_chunk_unpack_size (y, cinfo->width, cinfo->height, lpc, part);

    return EXR_UNLOCK_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
}